

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::concat<kj::FixedArray<char,1ul>,kj::StringPtr&,kj::CappedArray<char,14ul>>
          (String *__return_storage_ptr__,_ *this,FixedArray<char,_1UL> *params,StringPtr *params_1,
          CappedArray<char,_14UL> *params_2)

{
  void *__src;
  long lVar1;
  char *__n;
  _ *p_Var2;
  _ *__dest;
  
  heapString(__return_storage_ptr__,(size_t)((params_1->content).ptr + *(long *)(params + 8)));
  p_Var2 = (_ *)(__return_storage_ptr__->content).size_;
  if (p_Var2 != (_ *)0x0) {
    p_Var2 = (_ *)(__return_storage_ptr__->content).ptr;
  }
  __dest = p_Var2 + 1;
  *p_Var2 = *this;
  __src = *(void **)params;
  lVar1 = *(long *)(params + 8);
  if (__src != (void *)((long)__src + lVar1 + -1)) {
    memcpy(__dest,__src,lVar1 - 1);
    __dest = p_Var2 + lVar1;
  }
  __n = (params_1->content).ptr;
  if (__n != (char *)0x0) {
    memcpy(__dest,&(params_1->content).size_,(size_t)__n);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}